

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O3

void __thiscall
FIX::SocketAcceptor::SocketAcceptor
          (SocketAcceptor *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings)

{
  _Rb_tree_header *p_Var1;
  
  Acceptor::Acceptor(&this->super_Acceptor,application,factory,settings);
  (this->super_Acceptor)._vptr_Acceptor = (_func_int **)&PTR__SocketAcceptor_001f7380;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketAcceptor_001f73f8;
  this->m_pServer = (SocketServer *)0x0;
  p_Var1 = &(this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_sessionToPort)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessionToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessionToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sessionToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sessionToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_sessionToPort)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

EXCEPT(ConfigError)
    : Acceptor(application, factory, settings),
      m_pServer(0) {}